

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O2

void __thiscall fmt::v9::detail::print(detail *this,FILE *f,string_view text)

{
  fwrite_fully(f,1,(size_t)text.data_,(FILE *)this);
  return;
}

Assistant:

FMT_FUNC void print(std::FILE* f, string_view text) {
#ifdef _WIN32
  if (write_console(f, text)) return;
#endif
  detail::fwrite_fully(text.data(), 1, text.size(), f);
}